

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_grouping(lysc_ctx *ctx,lysp_node *pnode,lysp_node_grp *grp)

{
  uint16_t parsed_flags;
  int iVar1;
  ulong local_138;
  ulong local_118;
  uint64_t c__;
  lysc_node_container fake_container;
  lysp_node_uses fake_uses;
  char *pcStack_38;
  int len;
  char *path;
  lysp_node_grp *plStack_28;
  LY_ERR rc;
  lysp_node_grp *grp_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  path._4_4_ = 0;
  plStack_28 = grp;
  grp_local = (lysp_node_grp *)pnode;
  pnode_local = (lysp_node *)ctx;
  memset(&fake_container.notifs,0,0x58);
  fake_container.notifs = (lysc_node_notif *)grp_local;
  memset(&c__,0,0x78);
  c__._0_2_ = 1;
  fake_container.field_0._0_2_ = pnode_local->nodetype;
  fake_container.field_0._2_2_ = pnode_local->flags;
  fake_container.field_0._4_4_ = *(undefined4 *)&pnode_local->field_0xc;
  fake_container.field_0.node.next = (lysc_node *)&c__;
  fake_container.field_0.node.prev = (lysc_node *)anon_var_dwarf_5165f;
  if (grp_local == (lysp_node_grp *)0x0) {
    parsed_flags = 0;
  }
  else {
    parsed_flags = (grp_local->field_0).node.flags;
  }
  path._4_4_ = lys_compile_node_flags((lysc_ctx *)pnode_local,parsed_flags,0,(lysc_node *)&c__);
  if (path._4_4_ == LY_SUCCESS) {
    if ((plStack_28->field_0).node.parent != (lysp_node *)0x0) {
      ly_log((ly_ctx *)pnode_local->parent,LY_LLWRN,LY_SUCCESS,
             "Locally scoped grouping \"%s\" not used.",(plStack_28->field_0).node.name);
    }
    iVar1 = lys_compile_grouping_pathlog
                      ((lysc_ctx *)pnode_local,(plStack_28->field_0).node.parent,
                       &stack0xffffffffffffffc8);
    if (iVar1 < 0) {
      ly_log((ly_ctx *)pnode_local->parent,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_compile_grouping");
      return LY_EMEM;
    }
    strncpy((char *)&pnode_local[2].iffeatures,pcStack_38,0xfed);
    pnode_local[2].nodetype = (short)iVar1;
    pnode_local[2].flags = (short)((uint)iVar1 >> 0x10);
    free(pcStack_38);
    lysc_update_path((lysc_ctx *)pnode_local,(lys_module *)0x0,"{grouping}");
    lysc_update_path((lysc_ctx *)pnode_local,(lys_module *)0x0,(plStack_28->field_0).node.name);
    path._4_4_ = lys_compile_uses((lysc_ctx *)pnode_local,(lysp_node_uses *)&fake_container.notifs,
                                  (lysc_node *)&c__,0,(ly_set *)0x0);
    lysc_update_path((lysc_ctx *)pnode_local,(lys_module *)0x0,(char *)0x0);
    lysc_update_path((lysc_ctx *)pnode_local,(lys_module *)0x0,(char *)0x0);
    pnode_local[2].nodetype = 1;
    pnode_local[2].flags = 0;
    *(undefined1 *)((long)&pnode_local[2].iffeatures + 1) = 0;
  }
  lysc_node_container_free((lysf_ctx *)&pnode_local[2].next,(lysc_node_container *)&c__);
  local_118 = 0;
  while( true ) {
    if (fake_container.field_0.node.ref == (char *)0x0) {
      local_138 = 0;
    }
    else {
      local_138 = *(ulong *)(fake_container.field_0.node.ref + -8);
    }
    if (local_138 <= local_118) break;
    lysc_ext_instance_free
              ((lysf_ctx *)&pnode_local[2].next,
               (lysc_ext_instance *)(fake_container.field_0.node.ref + local_118 * 0x48));
    local_118 = local_118 + 1;
  }
  if (fake_container.field_0.node.ref != (char *)0x0) {
    free(fake_container.field_0.node.ref + -8);
  }
  return path._4_4_;
}

Assistant:

LY_ERR
lys_compile_grouping(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysp_node_grp *grp)
{
    LY_ERR rc = LY_SUCCESS;
    char *path;
    int len;

    /* use grouping status to avoid errors */
    struct lysp_node_uses fake_uses = {
        .parent = pnode,
        .nodetype = LYS_USES,
        .flags = grp->flags & LYS_STATUS_MASK, .next = NULL,
        .name = grp->name,
        .dsc = NULL, .ref = NULL, .when = NULL, .iffeatures = NULL, .exts = NULL,
        .refines = NULL, .augments = NULL
    };
    struct lysc_node_container fake_container = {
        .nodetype = LYS_CONTAINER,
        .flags = 0,
        .module = ctx->cur_mod,
        .parent = NULL, .next = NULL,
        .prev = &fake_container.node,
        .name = "fake",
        .dsc = NULL, .ref = NULL, .exts = NULL, .when = NULL,
        .child = NULL, .musts = NULL, .actions = NULL, .notifs = NULL
    };

    /* compile fake container flags */
    LY_CHECK_GOTO(rc = lys_compile_node_flags(ctx, pnode ? pnode->flags : 0, 0, &fake_container.node), cleanup);

    if (grp->parent) {
        LOGWRN(ctx->ctx, "Locally scoped grouping \"%s\" not used.", grp->name);
    }

    len = lys_compile_grouping_pathlog(ctx, grp->parent, &path);
    if (len < 0) {
        LOGMEM(ctx->ctx);
        return LY_EMEM;
    }
    strncpy(ctx->path, path, LYSC_CTX_BUFSIZE - 1);
    ctx->path_len = (uint32_t)len;
    free(path);

    lysc_update_path(ctx, NULL, "{grouping}");
    lysc_update_path(ctx, NULL, grp->name);
    rc = lys_compile_uses(ctx, &fake_uses, &fake_container.node, 0, NULL);
    lysc_update_path(ctx, NULL, NULL);
    lysc_update_path(ctx, NULL, NULL);

    ctx->path_len = 1;
    ctx->path[1] = '\0';

cleanup:
    lysc_node_container_free(&ctx->free_ctx, &fake_container);
    FREE_ARRAY(&ctx->free_ctx, fake_container.exts, lysc_ext_instance_free);
    return rc;
}